

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O2

ExactFloat __thiscall
ExactFloat::SignedSum(ExactFloat *this,int a_sign,ExactFloat *a,int b_sign,ExactFloat *b)

{
  BIGNUM *r_00;
  BIGNUM *a_00;
  BIGNUM *b_00;
  int iVar1;
  int iVar2;
  BIGNUM *extraout_RDX;
  BIGNUM *extraout_RDX_00;
  BIGNUM *extraout_RDX_01;
  BIGNUM *extraout_RDX_02;
  ExactFloat *r;
  ExactFloat *pEVar4;
  int iVar5;
  bool bVar6;
  ExactFloat EVar7;
  int local_44;
  S2LogMessage local_40;
  BigNum BVar3;
  
  iVar1 = a->bn_exp_;
  if (iVar1 < 0x7ffffffd) {
    iVar2 = b->bn_exp_;
    if (iVar2 < 0x7ffffffd) {
      pEVar4 = b;
      iVar5 = a_sign;
      local_44 = b_sign;
      if (iVar1 < iVar2) {
        pEVar4 = a;
        a = b;
        iVar5 = b_sign;
        local_44 = a_sign;
      }
      ExactFloat(this);
      iVar1 = pEVar4->bn_exp_;
      iVar2 = a->bn_exp_ - iVar1;
      if (iVar2 != 0 && iVar1 <= a->bn_exp_) {
        iVar1 = BN_lshift((BIGNUM *)(this->bn_).bn_,(BIGNUM *)(a->bn_).bn_,iVar2);
        if (iVar1 == 0) {
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                     ,0x22b,kFatal,(ostream *)&std::cerr);
          std::operator<<(local_40.stream_,
                          "Check failed: BN_lshift(r.bn_.get(), a->bn_.get(), a->bn_exp_ - b->bn_exp_) "
                         );
          goto LAB_0026b61f;
        }
        iVar1 = pEVar4->bn_exp_;
        a = this;
      }
      this->bn_exp_ = iVar1;
      r_00 = (BIGNUM *)(this->bn_).bn_;
      a_00 = (BIGNUM *)(a->bn_).bn_;
      b_00 = (BIGNUM *)(pEVar4->bn_).bn_;
      if (b_sign == a_sign) {
        iVar1 = BN_add(r_00,a_00,b_00);
        if (iVar1 == 0) {
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                     ,0x230,kFatal,(ostream *)&std::cerr);
          std::operator<<(local_40.stream_,
                          "Check failed: BN_add(r.bn_.get(), a->bn_.get(), b->bn_.get()) ");
          goto LAB_0026b61f;
        }
        goto LAB_0026b4ef;
      }
      iVar1 = BN_sub(r_00,a_00,b_00);
      if (iVar1 == 0) {
        S2LogMessage::S2LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                   ,0x236,kFatal,(ostream *)&std::cerr);
        std::operator<<(local_40.stream_,
                        "Check failed: BN_sub(r.bn_.get(), a->bn_.get(), b->bn_.get()) ");
        goto LAB_0026b61f;
      }
      iVar1 = BN_is_zero((this->bn_).bn_);
      if (iVar1 == 0) {
        iVar1 = BN_is_negative((this->bn_).bn_);
        if (iVar1 == 0) goto LAB_0026b4ef;
        this->sign_ = local_44;
        BN_set_negative((BIGNUM *)(this->bn_).bn_,0);
      }
      else {
        iVar5 = 1;
LAB_0026b4ef:
        this->sign_ = iVar5;
      }
      Canonicalize(this);
      BVar3.bn_ = extraout_RDX_00;
      goto LAB_0026b574;
    }
LAB_0026b3e4:
    pEVar4 = b;
    if (iVar2 != 0x7fffffff) {
      if (iVar1 == 0x7ffffffe) {
        bVar6 = a_sign != b_sign;
        b_sign = a_sign;
        if (bVar6 && iVar2 == 0x7ffffffe) {
          EVar7 = NaN();
          BVar3 = EVar7.bn_.bn_;
          goto LAB_0026b574;
        }
      }
      else if (iVar2 != 0x7ffffffe) {
        if (iVar1 == 0x7ffffffd) {
          if (iVar2 == 0x7ffffffd) {
            if (a_sign != b_sign) {
              a_sign = 1;
            }
            EVar7 = SignedZero(this,a_sign);
            BVar3 = EVar7.bn_.bn_;
          }
          else {
            ExactFloat(this,b);
            this->sign_ = b_sign;
            BVar3.bn_ = extraout_RDX_02;
          }
        }
        else {
          if (iVar2 != 0x7ffffffd) {
            S2LogMessage::S2LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                       ,0x21f,kFatal,(ostream *)&std::cerr);
            std::operator<<(local_40.stream_,"Check failed: b->is_zero() ");
LAB_0026b61f:
            abort();
          }
          ExactFloat(this,a);
          this->sign_ = a_sign;
          BVar3.bn_ = extraout_RDX_01;
        }
        goto LAB_0026b574;
      }
      EVar7 = Infinity(this,b_sign);
      BVar3 = EVar7.bn_.bn_;
      goto LAB_0026b574;
    }
  }
  else {
    pEVar4 = a;
    if (iVar1 != 0x7fffffff) {
      iVar2 = b->bn_exp_;
      goto LAB_0026b3e4;
    }
  }
  ExactFloat(this,pEVar4);
  BVar3.bn_ = extraout_RDX;
LAB_0026b574:
  EVar7.bn_.bn_ = BVar3.bn_;
  EVar7._0_8_ = this;
  return EVar7;
}

Assistant:

ExactFloat ExactFloat::SignedSum(int a_sign, const ExactFloat* a,
                                 int b_sign, const ExactFloat* b) {
  if (!a->is_normal() || !b->is_normal()) {
    // Handle zero, infinity, and NaN according to IEEE 754-2008.
    if (a->is_nan()) return *a;
    if (b->is_nan()) return *b;
    if (a->is_inf()) {
      // Adding two infinities with opposite sign yields NaN.
      if (b->is_inf() && a_sign != b_sign) return NaN();
      return Infinity(a_sign);
    }
    if (b->is_inf()) return Infinity(b_sign);
    if (a->is_zero()) {
      if (!b->is_zero()) return b->CopyWithSign(b_sign);
      // Adding two zeros with the same sign preserves the sign.
      if (a_sign == b_sign) return SignedZero(a_sign);
      // Adding two zeros of opposite sign produces +0.
      return SignedZero(+1);
    }
    S2_DCHECK(b->is_zero());
    return a->CopyWithSign(a_sign);
  }
  // Swap the numbers if necessary so that "a" has the larger bn_exp_.
  if (a->bn_exp_ < b->bn_exp_) {
    using std::swap;
    swap(a_sign, b_sign);
    swap(a, b);
  }
  // Shift "a" if necessary so that both values have the same bn_exp_.
  ExactFloat r;
  if (a->bn_exp_ > b->bn_exp_) {
    S2_CHECK(BN_lshift(r.bn_.get(), a->bn_.get(), a->bn_exp_ - b->bn_exp_));
    a = &r;  // The only field of "a" used below is bn_.
  }
  r.bn_exp_ = b->bn_exp_;
  if (a_sign == b_sign) {
    S2_CHECK(BN_add(r.bn_.get(), a->bn_.get(), b->bn_.get()));
    r.sign_ = a_sign;
  } else {
    // Note that the BIGNUM documentation is out of date -- all methods now
    // allow the result to be the same as any input argument, so it is okay if
    // (a == &r) due to the shift above.
    S2_CHECK(BN_sub(r.bn_.get(), a->bn_.get(), b->bn_.get()));
    if (BN_is_zero(r.bn_.get())) {
      r.sign_ = +1;
    } else if (BN_is_negative(r.bn_.get())) {
      // The magnitude of "b" was larger.
      r.sign_ = b_sign;
      BN_set_negative(r.bn_.get(), false);
    } else {
      // They were equal, or the magnitude of "a" was larger.
      r.sign_ = a_sign;
    }
  }
  r.Canonicalize();
  return r;
}